

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transmesh.c
# Opt level: O2

int main(int ArgCnt,char **ArgVec)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  GrpSct *pGVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  int *piVar9;
  int64_t MshIdx;
  int64_t MshIdx_00;
  int64_t NmbLin;
  void *__ptr;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  int *in_stack_ffffffffffff4fa8;
  undefined4 uVar17;
  int64_t local_b048;
  int NmbTyp;
  ulong local_b030;
  ulong local_b028;
  GrpSct *local_b020;
  int NmbNod;
  int deg;
  int dim;
  int InpVer;
  int SolSiz;
  char *local_b000;
  char *local_aff8;
  char **local_aff0;
  char *TmpStr2;
  char *TmpStr;
  int TokTab2 [1024];
  int TokTab [1024];
  int TypTab [1000];
  GrpSct GrpTab [1024];
  
  if (ArgCnt == 1) {
    puts("\nTRANSMESH v5.2, july 19 2017, Loic MARECHAL / INRIA\n");
    puts(" Usage    : transmesh source_name destination_name (-options)\n");
    puts(" optional : -v output_file_version");
    puts(" version 1: 32 bits integers, 32 bits reals, file size < 2 GigaBytes");
    puts(" version 2: 32 bits integers, 64 bits reals, file size < 2 GigaBytes");
    puts(" version 3: 32 bits integers, 64 bits reals, file size < 8 ExaBytes");
    puts(" version 4: 64 bits integers, 64 bits reals, file size < 8 ExaBytes\n");
    puts(" optional : -igroup inflow 1 Triangles 3,5,6,9-14");
    puts("            Defines a group named \"inflow\" with index 1 that includes");
    puts("            a set of comma-seprated triangle references.");
    puts("            You may also specify ranges between two dash-separated indices.\n");
    puts(" optional : -egroup wings 3 Quadrilaterals 6-20");
    puts("            Defines a group named \"wings\" with index 3 that excludes");
    puts("            a set of comma-seprated quadrilateral references.");
    puts("            You may also specify ranges between two dash-separated indices.\n");
    exit(0);
  }
  local_aff8 = ArgVec[1];
  local_b000 = ArgVec[2];
  iVar5 = strcmp(local_aff8,local_b000);
  if (iVar5 == 0) {
    puts("The output mesh cannot overwrite the input mesh.");
LAB_00106ba3:
    exit(1);
  }
  uVar16 = 0;
  memset(GmfMaxRefTab,0,0x3c4);
  local_b028 = local_b028 & 0xffffffff00000000;
  local_aff0 = ArgVec;
  iVar5 = 3;
LAB_0010640d:
  while( true ) {
    pcVar14 = local_aff8;
    uVar10 = uVar16 & 0xffffffff;
    if (ArgCnt <= iVar5) break;
    iVar6 = iVar5 + 1;
    pcVar14 = ArgVec[iVar5];
    if (((*pcVar14 == '-') && (pcVar14[1] == 'v')) && (pcVar14[2] == '\0')) {
      iVar6 = atoi(ArgVec[iVar6]);
      if (iVar6 - 5U < 0xfffffffc) {
        printf("Wrong size type : %d\n");
        goto LAB_00106ba3;
      }
      local_b028 = CONCAT44(local_b028._4_4_,iVar6);
      iVar6 = iVar5 + 2;
    }
    iVar5 = strcmp(pcVar14,"-igroup");
    if ((iVar5 == 0) || (iVar7 = strcmp(pcVar14,"-egroup"), iVar5 = iVar6, iVar7 == 0)) {
      local_b030 = (ulong)((int)uVar16 + 1);
      GrpTab[uVar10].NfoStr = ArgVec[iVar6];
      iVar5 = atoi(ArgVec[(long)iVar6 + 1]);
      GrpTab[uVar10].idx = iVar5;
      iVar5 = GetKwdIdx(ArgVec[(long)iVar6 + 2]);
      GrpTab[uVar10].typ = iVar5;
      iVar5 = iVar6 + 4;
      TmpStr = ArgVec[(long)iVar6 + 3];
      uVar12 = 0;
      local_b020 = GrpTab + uVar10;
LAB_001064c8:
      do {
        lVar15 = (long)(int)uVar12;
        if ((0x3ff < (int)uVar12) || (TmpStr2 = strsep(&TmpStr,","), TmpStr2 == (char *)0x0))
        goto LAB_001065a4;
        for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
          pcVar8 = strsep(&TmpStr2,"-");
          if (pcVar8 == (char *)0x0) {
            if ((int)lVar13 != 2) {
              if ((int)lVar13 != 1) goto LAB_00106ba3;
              uVar12 = uVar12 + 1;
              TokTab[lVar15] = TokTab2[0];
              goto LAB_001064c8;
            }
            break;
          }
          iVar6 = atoi(pcVar8);
          TokTab2[lVar13] = iVar6;
        }
        piVar9 = TokTab + lVar15;
        for (iVar6 = TokTab2[0]; iVar6 <= TokTab2[1]; iVar6 = iVar6 + 1) {
          *piVar9 = iVar6;
          uVar12 = uVar12 + 1;
          piVar9 = piVar9 + 1;
        }
      } while( true );
    }
  }
  iVar5 = 1;
  local_b020 = (GrpSct *)uVar10;
  MshIdx = GmfOpenMesh(local_aff8,1,&InpVer,&dim);
  pcVar8 = local_b000;
  if (MshIdx != 0) {
    uVar12 = (uint)local_b028;
    if ((uint)local_b028 == 0) {
      uVar12 = InpVer;
    }
    MshIdx_00 = GmfOpenMesh(local_b000,2,(ulong)uVar12);
    pcVar14 = pcVar8;
    if (MshIdx_00 != 0) {
      lVar15 = 0;
      local_b048 = MshIdx_00;
      local_b030 = uVar16;
      do {
        uVar16 = local_b030;
        if (lVar15 == 0xf1) {
          if ((int)local_b030 != 0) {
            GmfSetKwd(MshIdx_00,0x5e,(int64_t)local_b020);
            iVar6 = 0;
            while (uVar17 = (undefined4)((ulong)in_stack_ffffffffffff4fa8 >> 0x20),
                  iVar6 < (int)uVar16) {
              uVar10 = (ulong)GrpTab[iVar6].typ;
              if (GrpTab[iVar6].sgn == -1) {
                uVar12 = GmfMaxRefTab[uVar10];
                if (GmfMaxRefTab[uVar10] == 0) {
                  uVar12 = 0x400;
                }
                local_b028 = uVar10;
                __ptr = malloc((long)(int)(uVar12 + 1));
                uVar16 = 0;
                if (0 < (int)uVar12) {
                  uVar16 = (ulong)uVar12;
                }
                iVar7 = (int)uVar16 + 1;
                for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                  *(undefined1 *)((long)__ptr + uVar10 + 1) = 1;
                }
                uVar2 = GrpTab[iVar6].NmbRef;
                uVar10 = 0;
                if (0 < (int)uVar2) {
                  uVar10 = (ulong)uVar2;
                }
                piVar9 = GrpTab[iVar6].RefTab;
                for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
                  *(undefined1 *)((long)__ptr + (long)piVar9[uVar11]) = 0;
                }
                free(piVar9);
                uVar12 = uVar12 - uVar2;
                GrpTab[iVar6].NmbRef = uVar12;
                piVar9 = (int *)malloc((long)(int)uVar12 << 2);
                GrpTab[iVar6].RefTab = piVar9;
                iVar5 = 0;
                for (lVar15 = 1; lVar15 - uVar16 != 1; lVar15 = lVar15 + 1) {
                  if (*(char *)((long)__ptr + lVar15) != '\0') {
                    lVar13 = (long)iVar5;
                    iVar5 = iVar5 + 1;
                    piVar9[lVar13] = (int)lVar15;
                  }
                }
                free(__ptr);
                uVar10 = local_b028;
                uVar16 = local_b030;
              }
              else {
                uVar12 = GrpTab[iVar6].NmbRef;
                iVar7 = iVar6;
              }
              in_stack_ffffffffffff4fa8 = (int *)CONCAT44(uVar17,iVar5);
              GmfSetLin(MshIdx_00,0x5e,GrpTab[iVar6].NfoStr,(ulong)(uint)GrpTab[iVar6].idx,uVar10,
                        (ulong)uVar12,in_stack_ffffffffffff4fa8);
              iVar5 = iVar5 + uVar12;
              iVar6 = iVar7 + 1;
            }
            GmfSetKwd(MshIdx_00,0x5f,(long)(iVar5 + -1));
            for (uVar16 = 0; (GrpSct *)uVar16 != local_b020; uVar16 = uVar16 + 1) {
              uVar12 = GrpTab[uVar16].NmbRef;
              if (GrpTab[uVar16].NmbRef < 1) {
                uVar12 = 0;
              }
              for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
                GmfSetLin(MshIdx_00,0x5f,(ulong)(uint)GrpTab[uVar16].typ,
                          (ulong)(uint)GrpTab[uVar16].RefTab[uVar10],(ulong)(uint)GrpTab[uVar16].idx
                         );
              }
            }
          }
          iVar5 = GmfCloseMesh(MshIdx);
          if (iVar5 == 0) {
            return 1;
          }
          iVar5 = GmfCloseMesh(MshIdx_00);
          return (uint)(iVar5 == 0);
        }
        pcVar14 = GmfKwdFmt[lVar15][0];
        iVar6 = strcmp(pcVar14,"Reserved");
        if ((iVar6 != 0) && (iVar6 = strcmp(pcVar14,"End"), iVar6 != 0)) {
          iVar7 = (int)lVar15;
          iVar6 = GmfGotoKwd(MshIdx,iVar7);
          if (iVar6 != 0) {
            uVar12 = (byte)*GmfKwdFmt[lVar15][1] - 0x69;
            if (uVar12 == 0) {
              uVar12 = (uint)(byte)GmfKwdFmt[lVar15][1][1];
            }
            if (uVar12 == 0) {
              pbVar3 = (byte *)GmfKwdFmt[lVar15][2];
              bVar1 = *pbVar3;
              uVar12 = bVar1 - 0x73;
              if ((uVar12 == 0) && (uVar12 = pbVar3[1] - 0x72, uVar12 == 0)) {
                uVar12 = (uint)pbVar3[2];
              }
              if (uVar12 != 0) {
                if (bVar1 == 0x68) {
                  uVar12 = pbVar3[1] - 0x72;
                  if (uVar12 == 0) {
                    uVar12 = (uint)pbVar3[2];
                  }
                  if (uVar12 == 0) {
                    uVar12 = 0;
                    if ((bVar1 == 0x68) && (uVar12 = pbVar3[1] - 0x72, uVar12 == 0)) {
                      uVar12 = (uint)pbVar3[2];
                    }
                    if (uVar12 == 0) {
                      in_stack_ffffffffffff4fa8 = &NmbNod;
                      local_b048 = GmfStatKwd(MshIdx,iVar7,&NmbTyp,&SolSiz,TypTab,&deg,
                                              in_stack_ffffffffffff4fa8);
                      if (local_b048 == 0) goto LAB_0010689f;
                      in_stack_ffffffffffff4fa8 =
                           (int *)CONCAT44((int)((ulong)in_stack_ffffffffffff4fa8 >> 0x20),NmbNod);
                      GmfSetKwd(MshIdx_00,iVar7,local_b048,(ulong)(uint)NmbTyp,TypTab,
                                (ulong)(uint)deg,in_stack_ffffffffffff4fa8);
                    }
                    goto LAB_0010678d;
                  }
                }
                NmbLin = GmfStatKwd(MshIdx,iVar7);
                local_b048 = NmbLin;
                if (NmbLin != 0) goto LAB_00106786;
                goto LAB_001067db;
              }
              local_b048 = GmfStatKwd(MshIdx,iVar7,&NmbTyp,&SolSiz,TypTab);
              if (local_b048 != 0) {
                GmfSetKwd(MshIdx_00,iVar7,local_b048,(ulong)(uint)NmbTyp,TypTab);
                goto LAB_0010678d;
              }
LAB_0010689f:
              local_b048 = 0;
            }
            else {
              local_b048 = GmfStatKwd(MshIdx,iVar7);
              if (local_b048 == 0) {
LAB_001067db:
                local_b048 = 0;
              }
              else {
                NmbLin = 0;
LAB_00106786:
                GmfSetKwd(MshIdx_00,iVar7,NmbLin);
LAB_0010678d:
                printf("Parsing %s : %ld item\n",GmfKwdFmt[lVar15][0],local_b048);
                lVar13 = 0;
                if (0 < local_b048) {
                  lVar13 = local_b048;
                }
                while (lVar13 != 0) {
                  GmfCpyLin(MshIdx,MshIdx_00,iVar7);
                  lVar13 = lVar13 + -1;
                }
              }
            }
          }
        }
        lVar15 = lVar15 + 1;
      } while( true );
    }
  }
  fwrite("Source of error : TRANSMESH / OPEN_MESH\n",0x28,1,_stderr);
  fprintf(_stderr,"Cannot open %s\n",pcVar14);
  return 1;
LAB_001065a4:
  pGVar4 = local_b020;
  local_b020->NmbRef = uVar12;
  piVar9 = (int *)malloc(lVar15 << 2);
  ArgVec = local_aff0;
  uVar16 = local_b030;
  pGVar4->RefTab = piVar9;
  uVar10 = 0;
  if (0 < (int)uVar12) {
    uVar10 = (ulong)uVar12;
  }
  for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    piVar9[uVar11] = TokTab[uVar11];
  }
  iVar6 = strcmp(pcVar14,"-igroup");
  pGVar4->sgn = -(uint)(iVar6 != 0) | 1;
  goto LAB_0010640d;
}

Assistant:

int main(int ArgCnt, char **ArgVec)
{
   int      NmbTyp, SolSiz, TypTab[ GmfMaxTyp ], FilVer = 0, InpVer, OutVer = 1;
   int      i, j, dim, MaxRef, ArgIdx = 1, NmbGrp = 0, pos, deg, NmbNod;
   int64_t  NmbLin, InpIdx, OutIdx;
   char     *InpNam, *OutNam, *PtrArg, *FlgTab;
   GrpSct   GrpTab[ MaxGrp ], *grp;
#ifndef WIN32
   float    f;
   double   d;
   int      NmbTok, NmbTok2, TokTab[ MaxTok ], TokTab2[ MaxTok ];
   char     *MshNam[ StrSiz ], *TmpStr, *TmpStr2, *TmpStr3;
#endif

   if(ArgCnt == 1)
   {
      puts("\nTRANSMESH v5.2, july 19 2017, Loic MARECHAL / INRIA\n");
      puts(" Usage    : transmesh source_name destination_name (-options)\n");
      puts(" optional : -v output_file_version");
      puts(" version 1: 32 bits integers, 32 bits reals, file size < 2 GigaBytes");
      puts(" version 2: 32 bits integers, 64 bits reals, file size < 2 GigaBytes");
      puts(" version 3: 32 bits integers, 64 bits reals, file size < 8 ExaBytes");
      puts(" version 4: 64 bits integers, 64 bits reals, file size < 8 ExaBytes\n");
#ifndef WIN32
      puts(" optional : -igroup inflow 1 Triangles 3,5,6,9-14");
      puts("            Defines a group named \"inflow\" with index 1 that includes");
      puts("            a set of comma-seprated triangle references.");
      puts("            You may also specify ranges between two dash-separated indices.\n");
      puts(" optional : -egroup wings 3 Quadrilaterals 6-20");
      puts("            Defines a group named \"wings\" with index 3 that excludes");
      puts("            a set of comma-seprated quadrilateral references.");
      puts("            You may also specify ranges between two dash-separated indices.\n");
#endif
      exit(0);
   }

   InpNam = ArgVec[ ArgIdx++ ];
   OutNam = ArgVec[ ArgIdx++ ];

   if(!strcmp(InpNam, OutNam))
   {
      puts("The output mesh cannot overwrite the input mesh.");
      exit(1);
   }

   memset(GmfMaxRefTab, 0, (GmfMaxKwd + 1) * sizeof(int));

   while(ArgIdx < ArgCnt)
   {
      PtrArg = ArgVec[ ArgIdx++ ];

      if(!strcmp(PtrArg, "-v"))
      {
         FilVer = atoi(ArgVec[ ArgIdx++ ]);

         if( (FilVer < 1) || (FilVer > 4) )
         {
            printf("Wrong size type : %d\n", FilVer);
            exit(1);
         }
      }
#ifndef WIN32
      if(!strcmp(PtrArg, "-igroup") || !strcmp(PtrArg, "-egroup"))
      {
         grp = &GrpTab[ NmbGrp++ ];
         grp->NfoStr = ArgVec[ ArgIdx++ ];
         grp->idx = atoi(ArgVec[ ArgIdx++ ]);
         grp->typ = GetKwdIdx(ArgVec[ ArgIdx++ ]);
         grp->NmbRef = 0;
         NmbTok = 0;
         TmpStr = ArgVec[ ArgIdx++ ];

         while( (NmbTok < MaxTok) && ((TmpStr2 = strsep(&TmpStr, ","))) )
         {
            NmbTok2 = 0;

            while( (NmbTok2 < 2) && ((TmpStr3 = strsep(&TmpStr2, "-"))) )
               TokTab2[ NmbTok2++ ] = atoi(TmpStr3);

            if(NmbTok2 == 1)
               TokTab[ NmbTok++ ] = TokTab2[0];
            else if(NmbTok2 == 2)
               for(i=TokTab2[0]; i<=TokTab2[1]; i++)
                  TokTab[ NmbTok++ ] = i;
            else
               exit(1);
         }

         grp->NmbRef = NmbTok;
         grp->RefTab = malloc(grp->NmbRef * sizeof(int));

         for(i=0;i<grp->NmbRef;i++)
            grp->RefTab[i] = TokTab[i];

         if(!strcmp(PtrArg, "-igroup"))
            grp->sgn = 1;
         else
            grp->sgn = -1;
      }
#endif
   }

   if(!(InpIdx = GmfOpenMesh(InpNam, GmfRead, &InpVer, &dim)))
   {
      fprintf(stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
      fprintf(stderr,"Cannot open %s\n", InpNam);
      return(1);
   }

   if(FilVer)
      OutVer = FilVer;
   else
      OutVer = InpVer;

   if(!(OutIdx = GmfOpenMesh(OutNam, GmfWrite, OutVer, dim)))
   {
      fprintf(stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
      fprintf(stderr,"Cannot open %s\n", OutNam);
      return(1);
   }

   for(i=0;i<=GmfMaxKwd;i++)
   {
      if(!strcmp(GmfKwdFmt[i][0], "Reserved") || !strcmp(GmfKwdFmt[i][0], "End"))
         continue;

      if(!GmfGotoKwd(InpIdx, i))
         continue;

      if(strcmp("i", GmfKwdFmt[i][1]))
      {
         if((NmbLin = GmfStatKwd(InpIdx, i)))
            GmfSetKwd(OutIdx, i, 0);
         else
            continue;
      }
      else if(strcmp("sr", GmfKwdFmt[i][2]) && strcmp("hr", GmfKwdFmt[i][2]))
      {
         if((NmbLin = GmfStatKwd(InpIdx, i)))
            GmfSetKwd(OutIdx, i, NmbLin);
         else
            continue;
      }
      else
      {
         if(!strcmp("sr", GmfKwdFmt[i][2]))
         {
            if((NmbLin = GmfStatKwd(InpIdx, i, &NmbTyp, &SolSiz, TypTab)))
               GmfSetKwd(OutIdx, i,  NmbLin, NmbTyp, TypTab);
            else
               continue;
         }
         else if(!strcmp("hr", GmfKwdFmt[i][2]))
         {
            if((NmbLin = GmfStatKwd(InpIdx, i, &NmbTyp, &SolSiz, TypTab, &deg, &NmbNod)))
               GmfSetKwd(OutIdx, i,  NmbLin, NmbTyp, TypTab, deg, NmbNod);
            else
               continue;
         }
      }

      printf("Parsing %s : "INT64_T_FMT" item\n", GmfKwdFmt[i][0], NmbLin);

      for(j=1;j<=NmbLin;j++)
         GmfCpyLin(InpIdx, OutIdx, i);
   }

   if(NmbGrp)
   {
      GmfSetKwd(OutIdx, GmfIRefGroups, NmbGrp);
      pos = 1;

      for(i=0;i<NmbGrp;i++)
      {
         grp = &GrpTab[i];

         if(grp->sgn == -1)
         {
            MaxRef = GmfMaxRefTab[ grp->typ ] ? GmfMaxRefTab[ grp->typ ] : DefMaxRef;
            FlgTab = malloc(MaxRef+1);

            for(i=1;i<=MaxRef;i++)
               FlgTab[i] = 1;

            for(i=0;i<grp->NmbRef;i++)
               FlgTab[ grp->RefTab[i] ] = 0;

            free(grp->RefTab);
            grp->NmbRef = MaxRef - grp->NmbRef;
            grp->RefTab = malloc(grp->NmbRef * sizeof(int));
            pos = 0;

            for(i=1;i<=MaxRef;i++)
               if(FlgTab[i])
                  grp->RefTab[ pos++ ] = i;

            free(FlgTab);
         }

         GmfSetLin(OutIdx, GmfIRefGroups, grp->NfoStr, grp->idx, grp->typ, grp->NmbRef, pos);
         pos += grp->NmbRef;
      }

      GmfSetKwd(OutIdx, GmfDRefGroups, pos - 1);

      for(i=0;i<NmbGrp;i++)
      {
         grp = &GrpTab[i];

         for(j=0;j<grp->NmbRef;j++)
            GmfSetLin(OutIdx, GmfDRefGroups, grp->typ, grp->RefTab[j], grp->idx);
      }
   }

   if(!GmfCloseMesh(InpIdx))
      return(1);

   if(!GmfCloseMesh(OutIdx))
      return(1);

   return(0);
}